

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# member_function_pointer_kernel_1.h
# Opt level: O2

void __thiscall dlib::mfp_kernel_1_base_class<2UL>::clear(mfp_kernel_1_base_class<2UL> *this)

{
  undefined **local_48 [6];
  undefined8 *local_18;
  
  local_18 = local_48;
  local_48[1] = (undefined **)0x0;
  local_48[2]._0_4_ = 2;
  local_48[3] = (undefined **)0x0;
  local_48[4] = (undefined **)0x0;
  local_48[0] = &PTR__mp_base_base_001fa9c0;
  swap((mfp_kernel_1_base_class<2UL> *)local_48,this);
  (**(code **)*local_18)();
  return;
}

Assistant:

void clear(
        ) { mfp_kernel_1_base_class().swap(*this); }